

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O2

void __thiscall SimulationResult::UpdateStatistics(SimulationResult *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  uint i;
  ulong uVar4;
  double dVar5;
  undefined1 in_ZMM1 [64];
  
  uVar1 = this->_m_nr_stored;
  uVar3 = (ulong)uVar1;
  dVar5 = 0.0;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar5 = dVar5 + (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4];
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,uVar1);
  this->_m_avg_reward =
       (double)((ulong)(uVar3 == 0) * 0x7fefffffffffffff +
               (ulong)(uVar3 != 0) * (long)(dVar5 / auVar2._0_8_));
  return;
}

Assistant:

void SimulationResult::UpdateStatistics()
{ 
    // update the average reward
    double sum=0;
    for(unsigned int i=0;i<_m_nr_stored;i++)
        sum+=_m_rewards[i];

    if(_m_nr_stored>0)
        _m_avg_reward=sum/_m_nr_stored;
    else
        _m_avg_reward=DBL_MAX;
}